

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall cmTarget::NeedRelinkBeforeInstall(cmTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char *val;
  LinkClosure *pLVar5;
  string ll;
  string flagVar;
  string local_68;
  string local_48;
  
  if (MODULE_LIBRARY < this->TargetTypeValue) {
    return false;
  }
  if (this->TargetTypeValue == STATIC_LIBRARY) {
    return false;
  }
  if (this->HaveInstallRule != true) {
    return false;
  }
  this_00 = this->Makefile;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_SKIP_RPATH","");
  bVar3 = cmMakefile::IsOn(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    return false;
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BUILD_WITH_INSTALL_RPATH","")
  ;
  val = GetProperty(this,&local_68,this->Makefile);
  bVar3 = cmSystemTools::IsOn(val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    return false;
  }
  bVar3 = IsChrpathUsed(this,config);
  if (bVar3) {
    return false;
  }
  pLVar5 = GetLinkClosure(this,config);
  pcVar2 = (pLVar5->LinkerLanguage)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (pLVar5->LinkerLanguage)._M_string_length);
  if (local_68._M_string_length != 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_48);
    bVar3 = cmMakefile::IsSet(this->Makefile,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      bVar3 = HaveBuildTreeRPATH(this,config);
      bVar4 = true;
      if (!bVar3) {
        bVar4 = HaveInstallTreeRPATH(this);
      }
      goto LAB_002a9e1e;
    }
  }
  bVar4 = false;
LAB_002a9e1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool cmTarget::NeedRelinkBeforeInstall(const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if(this->TargetTypeValue != cmTarget::EXECUTABLE &&
     this->TargetTypeValue != cmTarget::SHARED_LIBRARY &&
     this->TargetTypeValue != cmTarget::MODULE_LIBRARY)
    {
    return false;
    }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if(!this->GetHaveInstallRule())
    {
    return false;
    }

  // If skipping all rpaths completely then no relinking is needed.
  if(this->Makefile->IsOn("CMAKE_SKIP_RPATH"))
    {
    return false;
    }

  // If building with the install-tree rpath no relinking is needed.
  if(this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"))
    {
    return false;
    }

  // If chrpath is going to be used no relinking is needed.
  if(this->IsChrpathUsed(config))
    {
    return false;
    }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    std::string flagVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    flagVar += ll;
    flagVar += "_FLAG";
    if(!this->Makefile->IsSet(flagVar))
      {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
      }
    }
  else
    {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
    }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  return this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH();
}